

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wajah.h
# Opt level: O3

void __thiscall Wajah::print(Wajah *this,FrameBuffer *fb)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  Polygon::print((FrameBuffer *)this->kepala);
  Polygon::print((FrameBuffer *)this->aliskiri);
  Polygon::print((FrameBuffer *)this->aliskanan);
  lVar6 = 0x40;
  lVar5 = 0x70;
  lVar4 = 0x58;
  lVar2 = 0x88;
  lVar3 = lVar2;
  lVar1 = 0x28;
  switch(this->mode) {
  case 1:
    break;
  case 2:
    Polygon::print((FrameBuffer *)this->bibirlebar);
    lVar3 = 0x90;
    break;
  case 3:
    Polygon::print((FrameBuffer *)this->bibirsempit);
    Polygon::print((FrameBuffer *)this->sedih);
    Polygon::print((FrameBuffer *)this->matakanansipit);
    lVar4 = 0x38;
    lVar3 = 0x48;
    lVar1 = 0x68;
    break;
  case 4:
    lVar6 = 0x50;
    lVar5 = 0x80;
    goto LAB_0010306c;
  case 5:
    lVar6 = 0x50;
    lVar5 = 0x80;
    lVar4 = 0xb0;
    lVar3 = 0xa0;
    lVar1 = 0xb8;
    break;
  default:
    goto switchD_00102fe1_default;
  }
  lVar2 = lVar1;
  Polygon::print(*(FrameBuffer **)((long)&this->kepala + lVar3));
  Polygon::print(*(FrameBuffer **)((long)&this->kepala + lVar4));
LAB_0010306c:
  Polygon::print(*(FrameBuffer **)((long)&this->kepala + lVar2));
  Polygon::print(*(FrameBuffer **)((long)&this->kepala + lVar5));
  Polygon::print(*(FrameBuffer **)((long)&this->kepala + lVar6));
switchD_00102fe1_default:
  Polygon::print((FrameBuffer *)this->rambut);
  Polygon::print_frame((FrameBuffer *)this->rambut,(int)fb,0xff,0xff,0xff);
  return;
}

Assistant:

void print(FrameBuffer& fb){
    kepala->print(fb);
    //hidKanan->print(fb);
    //hidKiri->print(fb);
    //hidung->print(fb);
    aliskiri->print(fb);
    aliskanan->print(fb);
    if(mode==1){
      mulut->print(fb);
      matakanan->print(fb);
      matakiri->print(fb);
      bolakanan->print(fb);
      bolakiri->print(fb);
    }
    else if(mode==2){
      bibirlebar->print(fb);
      senyum->print(fb);
      matakanan->print(fb);
      matakiri->print(fb);
      bolakanan->print(fb);
      bolakiri->print(fb);
    }
    else if(mode==3){
      bibirsempit->print(fb);
      sedih->print(fb);
      matakanansipit->print(fb);
      matakirisipit->print(fb);
      tangisankiri->print(fb);
      tangisankanan->print(fb);
      bolakanan->print(fb);
      bolakiri->print(fb);
    }
    else if(mode==4){
      mulut->print(fb);
      matakananmerem->print(fb);
      matakirimerem->print(fb);
    }
    else if(mode==5){
      bibirlebar->print(fb);
      tertawa->print(fb);
      gigi->print(fb);
      matakananmerem->print(fb);
      matakirimerem->print(fb);
    }
    rambut->print(fb);
    rambut->print_frame(fb,255,255,255,0);
  }